

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ParameterSymbolBase::checkDefaultExpression()::NameSyntax_const__
          (Visitor *this,NameSyntax *syntax)

{
  iterator pvVar1;
  add_pointer_t<variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_>_>
  ppEVar2;
  Symbol *in_RSI;
  LookupResult *in_RDI;
  add_pointer_t<variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_>_>
  elemSel;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *selector;
  iterator __end3;
  iterator __begin3;
  SmallVector<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_4UL>
  *__range3;
  LookupResult result;
  Compilation *in_stack_fffffffffffffd48;
  Compilation *this_00;
  iterator local_278;
  bitmask<slang::ast::LookupFlags> local_254;
  long local_250;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  aSStack_238 [7];
  Symbol *local_10;
  
  local_10 = in_RSI;
  LookupResult::LookupResult(in_RDI);
  this_00 = (Compilation *)in_RDI->found;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_254,ForceHierarchical);
  Lookup::name((NameSyntax *)result.selectors.stackBase._104_8_,
               (ASTContext *)result.selectors.stackBase._96_8_,
               (bitmask<slang::ast::LookupFlags>)result.selectors.stackBase._116_4_,
               (LookupResult *)result.selectors.stackBase._88_8_);
  LookupResult::reportDiags(in_RDI,(ASTContext *)in_stack_fffffffffffffd48);
  if (local_250 != 0) {
    in_stack_fffffffffffffd48 = ASTContext::getCompilation((ASTContext *)0x4d32bf);
    Compilation::noteReference(this_00,local_10,SUB81((ulong)in_RDI >> 0x38,0));
  }
  local_278 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
              ::begin(aSStack_238);
  pvVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
           ::end(aSStack_238);
  for (; local_278 != pvVar1; local_278 = local_278 + 1) {
    ppEVar2 = std::
              get_if<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                        ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          *)in_stack_fffffffffffffd48);
    if (ppEVar2 !=
        (add_pointer_t<variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_>_>
         )0x0) {
      slang::syntax::SyntaxNode::
      visit<slang::ast::ParameterSymbolBase::checkDefaultExpression()const::Visitor>
                ((SyntaxNode *)in_RDI,(Visitor *)in_stack_fffffffffffffd48);
    }
  }
  LookupResult::~LookupResult(in_RDI);
  return;
}

Assistant:

void handle(const NameSyntax& syntax) {
            LookupResult result;
            Lookup::name(syntax, context, LookupFlags::ForceHierarchical, result);
            result.reportDiags(context);
            if (result.found)
                context.getCompilation().noteReference(*result.found);

            for (auto& selector : result.selectors) {
                if (auto elemSel = std::get_if<0>(&selector))
                    (*elemSel)->visit(*this);
            }
        }